

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::add_header<char_const*,char_const*>
          (coro_http_response *this,char *k,char *v)

{
  allocator<char> local_52;
  allocator<char> local_51;
  undefined1 local_50 [64];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,k,&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x20),v,&local_52);
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::
  emplace_back<cinatra::resp_header>(&this->resp_headers_,(resp_header *)local_50);
  resp_header::~resp_header((resp_header *)local_50);
  return;
}

Assistant:

void add_header(auto k, auto v) {
    resp_headers_.emplace_back(resp_header{std::move(k), std::move(v)});
  }